

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

int __thiscall diy::FileStorage::make_file_record(FileStorage *this,string *filename,size_t sz)

{
  pointer pcVar1;
  int iVar2;
  mapped_type *pmVar3;
  int res;
  FileRecord fr;
  int local_84;
  CriticalMap *local_80;
  unique_lock<tthread::fast_mutex> local_78;
  critical_resource<int,_tthread::fast_mutex> *local_68;
  unique_lock<tthread::fast_mutex> local_60;
  long local_50 [2];
  critical_resource<unsigned_long,_tthread::fast_mutex> *local_40;
  unique_lock<tthread::fast_mutex> local_38;
  
  local_68 = &this->count_;
  local_60._M_device = &(this->count_).m_;
  local_60._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_60);
  local_60._M_owns = true;
  local_84 = local_68->x_;
  local_68->x_ = local_84 + 1;
  if (local_60._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_60._M_device)->mLock = 0;
    UNLOCK();
  }
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_68 = (critical_resource<int,_tthread::fast_mutex> *)sz;
  local_60._M_device = (mutex_type *)local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + filename->_M_string_length);
  local_80 = &this->filenames_;
  local_78._M_device = &(this->filenames_).m_;
  local_78._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_78);
  local_78._M_owns = true;
  pmVar3 = std::
           map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
           ::operator[](&local_80->x_,&local_84);
  pmVar3->size = (size_t)local_68;
  std::__cxx11::string::_M_assign((string *)&pmVar3->name);
  if ((local_78._M_owns == true) && (local_78._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_78._M_device)->mLock = 0;
    UNLOCK();
  }
  local_80 = (CriticalMap *)&this->current_size_;
  local_78._M_device = &(this->current_size_).m_;
  local_78._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_78);
  local_78._M_owns = true;
  *(unsigned_long *)&local_80->x_ = *(unsigned_long *)&local_80->x_ + sz;
  local_40 = &this->max_size_;
  local_38._M_device = &(this->max_size_).m_;
  local_38._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_38);
  iVar2 = local_84;
  local_38._M_owns = true;
  if (local_40->x_ < *(ulong *)&local_80->x_) {
    local_40->x_ = *(ulong *)&local_80->x_;
  }
  if (local_38._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_38._M_device)->mLock = 0;
    UNLOCK();
  }
  if ((local_78._M_owns == true) && (local_78._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_78._M_device)->mLock = 0;
    UNLOCK();
  }
  if (local_60._M_device != (mutex_type *)local_50) {
    operator_delete(local_60._M_device,local_50[0] + 1);
  }
  return iVar2;
}

Assistant:

int           make_file_record(const std::string& filename, size_t sz)
      {
        int res = (*count_.access())++;
        FileRecord  fr = { sz, filename };
        (*filenames_.access())[res] = fr;

        // keep track of sizes
        critical_resource<size_t>::accessor     cur = current_size_.access();
        *cur += sz;
        critical_resource<size_t>::accessor     max = max_size_.access();
        if (*cur > *max)
            *max = *cur;

        return res;
      }